

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx_functor::binary_op_max>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  __m128 _outp_1;
  __m128 _p_1;
  __m128 _b;
  __m256 _outp;
  __m256 _p;
  __m256 _b_avx;
  int i;
  int size;
  binary_op_max op;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  int local_1d4;
  undefined8 *local_1c0;
  undefined1 (*local_1b0) [32];
  undefined8 uStack_110;
  undefined8 uStack_108;
  
  local_1d4 = 0;
  uVar1 = *in_RSI;
  auVar2 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar1),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar1),0x30);
  auVar3 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar1),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar1),0x30);
  uStack_110 = auVar2._0_8_;
  uStack_108 = auVar2._8_8_;
  local_1c0 = in_RDX;
  local_1b0 = in_RDI;
  for (; local_1d4 + 7 < in_ECX * in_R8D; local_1d4 = local_1d4 + 8) {
    auVar4._16_8_ = uStack_110;
    auVar4._0_16_ = auVar3;
    auVar4._24_8_ = uStack_108;
    auVar4 = vmaxps_avx(*local_1b0,auVar4);
    local_240 = auVar4._0_8_;
    uStack_238 = auVar4._8_8_;
    uStack_230 = auVar4._16_8_;
    uStack_228 = auVar4._24_8_;
    *local_1c0 = local_240;
    local_1c0[1] = uStack_238;
    local_1c0[2] = uStack_230;
    local_1c0[3] = uStack_228;
    local_1b0 = local_1b0 + 1;
    local_1c0 = local_1c0 + 4;
  }
  uVar1 = *in_RSI;
  auVar2._4_4_ = uVar1;
  auVar2._0_4_ = uVar1;
  auVar2._12_4_ = uVar1;
  auVar2._8_4_ = uVar1;
  for (; local_1d4 + 3 < in_ECX * in_R8D; local_1d4 = local_1d4 + 4) {
    auVar3 = vmaxps_avx(*(undefined1 (*) [16])*local_1b0,auVar2);
    local_270 = auVar3._0_8_;
    uStack_268 = auVar3._8_8_;
    *local_1c0 = local_270;
    local_1c0[1] = uStack_268;
    local_1b0 = (undefined1 (*) [32])(*local_1b0 + 0x10);
    local_1c0 = local_1c0 + 2;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}